

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O0

void * htable_val(htable *ht,htable_iter *i,size_t hash,uintptr_t perfect)

{
  uintptr_t uVar1;
  void *pvVar2;
  ulong local_38;
  uintptr_t h2;
  uintptr_t perfect_local;
  size_t hash_local;
  htable_iter *i_local;
  htable *ht_local;
  
  uVar1 = get_hash_ptr_bits(ht,hash);
  local_38 = uVar1 | perfect;
  while( true ) {
    if (ht->table[i->off] == 0) {
      return (void *)0x0;
    }
    if ((ht->table[i->off] != 1) &&
       (uVar1 = get_extra_ptr_bits(ht,ht->table[i->off]), uVar1 == local_38)) break;
    i->off = i->off + 1 & (long)((1 << ((byte)ht->bits & 0x1f)) + -1);
    local_38 = (perfect ^ 0xffffffffffffffff) & local_38;
  }
  pvVar2 = get_raw_ptr(ht,ht->table[i->off]);
  return pvVar2;
}

Assistant:

static void *htable_val(const struct htable *ht,
			struct htable_iter *i, size_t hash, uintptr_t perfect)
{
	uintptr_t h2 = get_hash_ptr_bits(ht, hash) | perfect;

	while (ht->table[i->off]) {
		if (ht->table[i->off] != HTABLE_DELETED) {
			if (get_extra_ptr_bits(ht, ht->table[i->off]) == h2)
				return get_raw_ptr(ht, ht->table[i->off]);
		}
		i->off = (i->off + 1) & ((1 << ht->bits)-1);
		h2 &= ~perfect;
	}
	return NULL;
}